

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Parser * Catch::makeCommandLineParser(ConfigData *config)

{
  Parser *this;
  long in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  anon_class_8_1_50637480_for_m_lambda setReporter;
  anon_class_8_1_50637480_for_m_lambda setVerbosity;
  anon_class_8_1_50637480_for_m_lambda setWaitForKeypress;
  anon_class_8_1_50637480_for_m_lambda setColourUsage;
  anon_class_8_1_50637480_for_m_lambda setRngSeed;
  anon_class_8_1_50637480_for_m_lambda setTestOrder;
  anon_class_8_1_50637480_for_m_lambda loadTestNamesFromFile;
  anon_class_8_1_50637480_for_m_lambda setWarning;
  Parser *cli;
  string *in_stack_ffffffffffffd228;
  Opt *in_stack_ffffffffffffd230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd238;
  Opt *in_stack_ffffffffffffd240;
  allocator *paVar1;
  string *in_stack_ffffffffffffd248;
  Opt *in_stack_ffffffffffffd250;
  bool *in_stack_ffffffffffffd290;
  Help *in_stack_ffffffffffffd298;
  Opt *in_stack_ffffffffffffd2c0;
  Opt *other;
  Parser *in_stack_ffffffffffffd2c8;
  Help *in_stack_ffffffffffffd310;
  ComposableParserImpl<Catch::clara::detail::ExeName> *in_stack_ffffffffffffd318;
  allocator local_27e1;
  allocator local_27e0;
  allocator local_27df;
  allocator local_27de;
  allocator local_27dd;
  allocator local_27dc;
  allocator local_27db;
  allocator local_27da;
  undefined1 local_27d9 [2];
  allocator local_27d7;
  allocator local_27d6;
  allocator local_27d5;
  allocator local_27d4;
  allocator local_27d3;
  allocator local_27d2;
  allocator local_27d1;
  allocator local_27d0;
  allocator local_27cf;
  allocator local_27ce;
  allocator local_27cd;
  allocator local_27cc;
  allocator local_27cb;
  allocator local_27ca;
  allocator local_27c9;
  allocator local_27c8;
  allocator local_27c7;
  allocator local_27c6;
  allocator local_27c5;
  allocator local_27c4;
  allocator local_27c3;
  allocator local_27c2;
  allocator local_27c1;
  allocator local_27c0;
  allocator local_27bf;
  allocator local_27be;
  allocator local_27bd;
  allocator local_27bc;
  allocator local_27bb;
  allocator local_27ba;
  allocator local_27b9;
  allocator local_27b8;
  allocator local_27b7;
  allocator local_27b6;
  allocator local_27b5;
  allocator local_27b4;
  allocator local_27b3;
  allocator local_27b2;
  allocator local_27b1;
  allocator local_27b0;
  allocator local_27af;
  allocator local_27ae;
  allocator local_27ad;
  allocator local_27ac;
  allocator local_27ab;
  allocator local_27aa;
  allocator local_27a9 [9];
  allocator local_27a0;
  allocator local_279f;
  allocator local_279e;
  allocator local_279d;
  allocator local_279c;
  allocator local_279b;
  allocator local_279a;
  allocator local_2799;
  long local_2798;
  allocator local_278b;
  allocator local_278a;
  allocator local_2789 [15];
  allocator local_277a;
  allocator local_2779;
  allocator local_2778;
  allocator local_2777;
  allocator local_2776;
  allocator local_2775;
  allocator local_2774;
  allocator local_2773;
  allocator local_2772;
  allocator local_2771;
  allocator local_2770;
  allocator local_276f;
  allocator local_276e;
  allocator local_276d;
  allocator local_276c;
  allocator local_276b;
  allocator local_276a;
  allocator local_2769;
  allocator local_2768;
  allocator local_2767;
  allocator local_2766;
  allocator local_2765;
  allocator local_2764;
  allocator local_2763;
  allocator local_2762;
  allocator local_2761;
  allocator local_2760;
  allocator local_275f;
  allocator local_275e;
  allocator local_275d [3036];
  undefined1 local_1b81;
  long local_1b40;
  string local_1b30 [32];
  string local_1b10 [128];
  string local_1a90 [32];
  string local_1a70 [32];
  string local_1a50 [152];
  string local_19b8 [32];
  string local_1998 [152];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [152];
  string local_1828 [32];
  string local_1808 [32];
  string local_17e8 [152];
  string local_1750 [32];
  string local_1730 [32];
  string local_1710 [152];
  string local_1678 [32];
  string local_1658 [32];
  string local_1638 [152];
  string local_15a0 [32];
  string local_1580 [152];
  string local_14e8 [32];
  string local_14c8 [32];
  string local_14a8 [152];
  string local_1410 [32];
  string local_13f0 [32];
  string local_13d0 [152];
  string local_1338 [32];
  string local_1318 [32];
  string local_12f8 [152];
  string local_1260 [32];
  string local_1240 [152];
  string local_11a8 [32];
  string local_1188 [152];
  string local_10f0 [32];
  string local_10d0 [32];
  string local_10b0 [32];
  string local_1090 [152];
  string local_ff8 [32];
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [152];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [152];
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  string local_dc8 [152];
  string local_d30 [32];
  string local_d10 [32];
  string local_cf0 [32];
  string local_cd0 [152];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [152];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [152];
  string local_a48 [32];
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [152];
  string local_950 [32];
  string local_930 [32];
  string local_910 [152];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [152];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [152];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  string local_628 [152];
  string local_590 [32];
  string local_570 [32];
  string local_550 [152];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [152];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [152];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [152];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [152];
  string local_158 [32];
  string local_138 [32];
  string local_118 [272];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b81 = 0;
  local_1b40 = in_RSI;
  clara::detail::ExeName::ExeName((ExeName *)in_stack_ffffffffffffd250,in_stack_ffffffffffffd248);
  clara::detail::Help::Help(in_stack_ffffffffffffd298,in_stack_ffffffffffffd290);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (in_stack_ffffffffffffd318,in_stack_ffffffffffffd310);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"-l",local_275d);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"--list-tests",&local_275e);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"list all/matching test cases",&local_275f);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"-t",&local_2760);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"--list-tags",&local_2761);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"list all/matching tags",&local_2762);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"-s",&local_2763);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"--success",&local_2764);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"include successful tests in output",&local_2765);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"-b",&local_2766);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"--break",&local_2767);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"break into debugger on failure",&local_2768);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"-e",&local_2769);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"--nothrow",&local_276a);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"skip exception tests",&local_276b);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"-i",&local_276c);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"--invisibles",&local_276d);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"show invisibles (tabs, newlines)",&local_276e);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"filename",&local_276f);
  clara::detail::Opt::Opt<std::__cxx11::string>
            (in_stack_ffffffffffffd240,in_stack_ffffffffffffd238,(string *)in_stack_ffffffffffffd230
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"-o",&local_2770);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"--out",&local_2771);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"output filename",&local_2772);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"name",&local_2773);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__0>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"-r",&local_2774);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"--reporter",&local_2775);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"reporter to use (defaults to console)",&local_2776);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"name",&local_2777);
  clara::detail::Opt::Opt<std::__cxx11::string>
            (in_stack_ffffffffffffd240,in_stack_ffffffffffffd238,(string *)in_stack_ffffffffffffd230
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"-n",&local_2778);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"--name",&local_2779);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"suite name",&local_277a);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  local_2789[1] = (allocator)(undefined1)local_1b40;
  local_2789[2] = (allocator)local_1b40._1_1_;
  local_2789[3] = (allocator)local_1b40._2_1_;
  local_2789[4] = (allocator)local_1b40._3_1_;
  local_2789[5] = (allocator)local_1b40._4_1_;
  local_2789[6] = (allocator)local_1b40._5_1_;
  local_2789[7] = (allocator)local_1b40._6_1_;
  local_2789[8] = (allocator)local_1b40._7_1_;
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__1>
            (in_stack_ffffffffffffd250,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_910,"-a",local_2789);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_930,"--abort",&local_278a);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_950,"abort at first failure",&local_278b);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  local_2798 = local_1b40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"no. failures",&local_2799);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__2>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"-x",&local_279a);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a28,"--abortx",&local_279b);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a48,"abort after x failures",&local_279c);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"warning name",&local_279d);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"-w",&local_279e);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b20,"--warn",&local_279f);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b40,"enable warnings",&local_27a0);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  local_27a9[1] = (allocator)(undefined1)local_1b40;
  local_27a9[2] = (allocator)local_1b40._1_1_;
  local_27a9[3] = (allocator)local_1b40._2_1_;
  local_27a9[4] = (allocator)local_1b40._3_1_;
  local_27a9[5] = (allocator)local_1b40._4_1_;
  local_27a9[6] = (allocator)local_1b40._5_1_;
  local_27a9[7] = (allocator)local_1b40._6_1_;
  local_27a9[8] = (allocator)local_1b40._7_1_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"yes|no",local_27a9);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__4>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"-d",&local_27aa);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"--durations",&local_27ab);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c38,"show test durations",&local_27ac);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd0,"seconds",&local_27ad);
  clara::detail::Opt::Opt<double>
            (in_stack_ffffffffffffd240,(double *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"-D",&local_27ae);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d10,"--min-duration",&local_27af);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d30,"show test durations for tests taking at least the given number of seconds",
             &local_27b0);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"filename",&local_27b1);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de8,"-f",&local_27b2);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e08,"--input-file",&local_27b3);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e28,"load test names to run from a file",&local_27b4);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec0,"-#",&local_27b5);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee0,"--filenames-as-tags",&local_27b6);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f00,"adds a tag for the filename",&local_27b7);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f98,"section name",&local_27b8);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffd240,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd238,(string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb8,"-c",&local_27b9);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd8,"--section",&local_27ba);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ff8,"specify section to run",&local_27bb);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1090,"quiet|normal|high",&local_27bc);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__6>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10b0,"-v",&local_27bd);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10d0,"--verbosity",&local_27be);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10f0,"set output verbosity",&local_27bf);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1188,"--list-test-names-only",&local_27c0);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a8,"list all/matching test cases names only",&local_27c1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1240,"--list-reporters",&local_27c2);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1260,"list all reporters",&local_27c3);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"decl|lex|rand",&local_27c4);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__7>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1318,"--order",&local_27c5);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1338,"test case order (defaults to decl)",&local_27c6);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13d0,"\'time\'|number",&local_27c7);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__8>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13f0,"--rng-seed",&local_27c8);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1410,"set a specific seed for random numbers",&local_27c9);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14a8,"yes|no",&local_27ca);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__9>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14c8,"--use-colour",&local_27cb);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e8,"should output be colourised",&local_27cc);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1580,"--libidentify",&local_27cd);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_15a0,"report name and version according to libidentify standard",&local_27ce);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1638,"never|start|exit|both",&local_27cf);
  clara::detail::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__10>
            (in_stack_ffffffffffffd240,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1658,"--wait-for-keypress",&local_27d0);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1678,"waits for a keypress before exiting",&local_27d1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1710,"samples",&local_27d2);
  clara::detail::Opt::Opt<unsigned_int>
            (in_stack_ffffffffffffd240,(uint *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1730,"--benchmark-samples",&local_27d3);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  paVar1 = &local_27d4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1750,"number of samples to collect (default: 100)",paVar1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17e8,"resamples",&local_27d5);
  clara::detail::Opt::Opt<unsigned_int>
            (in_stack_ffffffffffffd240,(uint *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1808,"--benchmark-resamples",&local_27d6);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1828,"number of resamples for the bootstrap (default: 100000)",&local_27d7);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(in_stack_ffffffffffffd2c8,in_stack_ffffffffffffd2c0);
  this = (Parser *)(local_1b40 + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18c0,"confidence interval",(allocator *)(local_27d9 + 1));
  clara::detail::Opt::Opt<double>
            (in_stack_ffffffffffffd240,(double *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  other = (Opt *)local_27d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18e0,"--benchmark-confidence-interval",(allocator *)other);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1900,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_27da);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(this,other);
  clara::detail::Opt::Opt(in_stack_ffffffffffffd250,(bool *)in_stack_ffffffffffffd248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1998,"--benchmark-no-analysis",&local_27db);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  paVar1 = &local_27dc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_19b8,"perform only measurements; do not perform any analysis",paVar1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(this,other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a50,"benchmarkWarmupTime",&local_27dd);
  clara::detail::Opt::Opt<long>
            (in_stack_ffffffffffffd240,(long *)in_stack_ffffffffffffd238,
             (string *)in_stack_ffffffffffffd230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a70,"--benchmark-warmup-time",&local_27de);
  clara::detail::Opt::operator[](in_stack_ffffffffffffd230,in_stack_ffffffffffffd228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a90,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_27df);
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::operator()
            (&in_stack_ffffffffffffd230->super_ParserRefImpl<Catch::clara::detail::Opt>,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(this,other);
  paVar1 = &local_27e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b10,"test name|pattern|tags",paVar1);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            ((Arg *)in_stack_ffffffffffffd240,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd238,(string *)in_stack_ffffffffffffd230);
  paVar1 = &local_27e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b30,"which test or tests to use",paVar1);
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::operator()
            ((ParserRefImpl<Catch::clara::detail::Arg> *)in_stack_ffffffffffffd230,
             in_stack_ffffffffffffd228);
  clara::detail::Parser::operator|(this,(Arg *)other);
  std::__cxx11::string::~string(local_1b30);
  std::allocator<char>::~allocator((allocator<char> *)&local_27e1);
  clara::detail::Arg::~Arg((Arg *)0x22f764);
  std::__cxx11::string::~string(local_1b10);
  std::allocator<char>::~allocator((allocator<char> *)&local_27e0);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_27df);
  std::__cxx11::string::~string(local_1a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_27de);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_27dd);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_19b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27dc);
  std::__cxx11::string::~string(local_1998);
  std::allocator<char>::~allocator((allocator<char> *)&local_27db);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1900);
  std::allocator<char>::~allocator((allocator<char> *)&local_27da);
  std::__cxx11::string::~string(local_18e0);
  std::allocator<char>::~allocator((allocator<char> *)local_27d9);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_18c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_27d9 + 1));
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1828);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d7);
  std::__cxx11::string::~string(local_1808);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d6);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_17e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d5);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1750);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d4);
  std::__cxx11::string::~string(local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d3);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1710);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d2);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1678);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d1);
  std::__cxx11::string::~string(local_1658);
  std::allocator<char>::~allocator((allocator<char> *)&local_27d0);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1638);
  std::allocator<char>::~allocator((allocator<char> *)&local_27cf);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ce);
  std::__cxx11::string::~string(local_1580);
  std::allocator<char>::~allocator((allocator<char> *)&local_27cd);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27cc);
  std::__cxx11::string::~string(local_14c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27cb);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_14a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ca);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1410);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c9);
  std::__cxx11::string::~string(local_13f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c8);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_13d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c7);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1338);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c6);
  std::__cxx11::string::~string(local_1318);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c5);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c4);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1260);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c3);
  std::__cxx11::string::~string(local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c2);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_11a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c1);
  std::__cxx11::string::~string(local_1188);
  std::allocator<char>::~allocator((allocator<char> *)&local_27c0);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27bf);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27be);
  std::__cxx11::string::~string(local_10b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27bd);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_1090);
  std::allocator<char>::~allocator((allocator<char> *)&local_27bc);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27bb);
  std::__cxx11::string::~string(local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ba);
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b9);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b8);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b7);
  std::__cxx11::string::~string(local_ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b6);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b5);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b4);
  std::__cxx11::string::~string(local_e08);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b3);
  std::__cxx11::string::~string(local_de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b2);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b1);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b0);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator((allocator<char> *)&local_27af);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ae);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ad);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_c38);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ac);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_27ab);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27aa);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)local_27a9);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator((allocator<char> *)&local_27a0);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_279f);
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_279e);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_279d);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_279c);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator((allocator<char> *)&local_279b);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator((allocator<char> *)&local_279a);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2799);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_278b);
  std::__cxx11::string::~string(local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_278a);
  std::__cxx11::string::~string(local_910);
  std::allocator<char>::~allocator((allocator<char> *)local_2789);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_277a);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_2779);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_2778);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_2777);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_2776);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_2775);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_2774);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_2773);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_2772);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_2771);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_2770);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_276f);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_276e);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_276d);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_276c);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_276b);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_276a);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_2769);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2768);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2767);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2766);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_2765);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2764);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2763);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_2762);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_2761);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2760);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_275f);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_275e);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)local_275d);
  clara::detail::Opt::~Opt(in_stack_ffffffffffffd230);
  clara::detail::Parser::~Parser((Parser *)in_stack_ffffffffffffd230);
  clara::detail::Help::~Help((Help *)0x230464);
  clara::detail::ExeName::~ExeName((ExeName *)in_stack_ffffffffffffd230);
  local_1b81 = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }